

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::MeshGeometry::ReadVertexData(MeshGeometry *this,string *type,int index,Scope *source)

{
  string *psVar1;
  bool bVar2;
  Element *pEVar3;
  Token *pTVar4;
  size_type sVar5;
  size_type sVar6;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar7;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  Token *t;
  Token *t_00;
  Token *t_01;
  int local_45c;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  int *local_2d8;
  int *local_2d0;
  size_type local_2c8;
  size_t count_neg;
  vector<int,_std::allocator<int>_> temp_materials;
  allocator local_281;
  string local_280;
  Element *local_260;
  Element *Name;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  allocator local_d1;
  string local_d0;
  string local_b0;
  string *local_90;
  string *ReferenceInformationType;
  allocator local_71;
  string local_70;
  string local_50;
  string *local_30;
  string *MappingInformationType;
  Scope *source_local;
  string *psStack_18;
  int index_local;
  string *type_local;
  MeshGeometry *this_local;
  
  MappingInformationType = (string *)source;
  source_local._4_4_ = index;
  psStack_18 = type;
  type_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"MappingInformationType",&local_71);
  pEVar3 = GetRequiredElement(source,&local_70,(Element *)0x0);
  pTVar4 = GetRequiredToken(pEVar3,0);
  ParseTokenAsString_abi_cxx11_(&local_50,(FBX *)pTVar4,t);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  psVar1 = MappingInformationType;
  local_30 = &local_50;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d0,"ReferenceInformationType",&local_d1);
  pEVar3 = GetRequiredElement((Scope *)psVar1,&local_d0,(Element *)0x0);
  pTVar4 = GetRequiredToken(pEVar3,0);
  ParseTokenAsString_abi_cxx11_(&local_b0,(FBX *)pTVar4,t_00);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  local_90 = &local_b0;
  bVar2 = std::operator==(psStack_18,"LayerElementUV");
  psVar1 = MappingInformationType;
  if (bVar2) {
    if (7 < source_local._4_4_) {
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[60]>
                (&local_250,
                 (char (*) [60])"ignoring UV layer, maximum number of UV channels exceeded: ");
      pbVar7 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                          &local_250,(int *)((long)&source_local + 4));
      pbVar7 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator<<(pbVar7,(char (*) [12])" (limit is ");
      Name._4_4_ = 8;
      pbVar7 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator<<(pbVar7,(int *)((long)&Name + 4));
      pbVar8 = Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator<<(pbVar7,(char (*) [2])0x2c30df);
      LogFunctions<Assimp::FBXImporter>::LogError(pbVar8);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter(&local_250);
      Name._0_4_ = 1;
      goto LAB_0021ca84;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_280,"Name",&local_281);
    pEVar3 = Scope::operator[]((Scope *)psVar1,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::allocator<char>::~allocator((allocator<char> *)&local_281);
    local_260 = pEVar3;
    std::__cxx11::string::operator=
              ((string *)(&this->field_0x100 + (long)source_local._4_4_ * 0x20),"");
    if (local_260 != (Element *)0x0) {
      pTVar4 = GetRequiredToken(local_260,0);
      ParseTokenAsString_abi_cxx11_
                ((string *)
                 &temp_materials.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(FBX *)pTVar4,t_01);
      std::__cxx11::string::operator=
                ((string *)(&this->field_0x100 + (long)source_local._4_4_ * 0x20),
                 (string *)
                 &temp_materials.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string
                ((string *)
                 &temp_materials.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
    ReadVertexDataUV(this,this->m_uvs + source_local._4_4_,(Scope *)MappingInformationType,local_30,
                     local_90);
  }
  else {
    bVar2 = std::operator==(psStack_18,"LayerElementMaterial");
    if (bVar2) {
      sVar6 = std::vector<int,_std::allocator<int>_>::size(&this->m_materials);
      if (sVar6 != 0) {
        LogFunctions<Assimp::FBXImporter>::LogError("ignoring additional material layer");
        Name._0_4_ = 1;
        goto LAB_0021ca84;
      }
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&count_neg);
      ReadVertexDataMaterials
                (this,(vector<int,_std::allocator<int>_> *)&count_neg,
                 (Scope *)MappingInformationType,local_30,local_90);
      local_2d0 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                   ((vector<int,_std::allocator<int>_> *)&count_neg);
      local_2d8 = (int *)std::vector<int,_std::allocator<int>_>::end
                                   ((vector<int,_std::allocator<int>_> *)&count_neg);
      sVar6 = std::
              count_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,Assimp::FBX::MeshGeometry::ReadVertexData(std::__cxx11::string_const&,int,Assimp::FBX::Scope_const&)::__0>
                        (local_2d0,local_2d8);
      local_2c8 = sVar6;
      sVar5 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)&count_neg);
      if (sVar6 != sVar5) {
        std::swap<int,std::allocator<int>>
                  ((vector<int,_std::allocator<int>_> *)&count_neg,&this->m_materials);
      }
      else {
        LogFunctions<Assimp::FBXImporter>::LogWarn("ignoring dummy material layer (all entries -1)")
        ;
      }
      Name._0_4_ = (uint)(sVar6 == sVar5);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)&count_neg);
      if ((uint)Name != 0) goto LAB_0021ca84;
    }
    else {
      bVar2 = std::operator==(psStack_18,"LayerElementNormal");
      if (bVar2) {
        sVar6 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                          (&this->m_normals);
        if (sVar6 != 0) {
          LogFunctions<Assimp::FBXImporter>::LogError("ignoring additional normal layer");
          Name._0_4_ = 1;
          goto LAB_0021ca84;
        }
        ReadVertexDataNormals
                  (this,&this->m_normals,(Scope *)MappingInformationType,local_30,local_90);
      }
      else {
        bVar2 = std::operator==(psStack_18,"LayerElementTangent");
        if (bVar2) {
          sVar6 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                            (&this->m_tangents);
          if (sVar6 != 0) {
            LogFunctions<Assimp::FBXImporter>::LogError("ignoring additional tangent layer");
            Name._0_4_ = 1;
            goto LAB_0021ca84;
          }
          ReadVertexDataTangents
                    (this,&this->m_tangents,(Scope *)MappingInformationType,local_30,local_90);
        }
        else {
          bVar2 = std::operator==(psStack_18,"LayerElementBinormal");
          if (bVar2) {
            sVar6 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                              (&this->m_binormals);
            if (sVar6 != 0) {
              LogFunctions<Assimp::FBXImporter>::LogError("ignoring additional binormal layer");
              Name._0_4_ = 1;
              goto LAB_0021ca84;
            }
            ReadVertexDataBinormals
                      (this,&this->m_binormals,(Scope *)MappingInformationType,local_30,local_90);
          }
          else {
            bVar2 = std::operator==(psStack_18,"LayerElementColor");
            if (bVar2) {
              if (7 < source_local._4_4_) {
                Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
                basic_formatter<char[69]>
                          (&local_458,
                           (char (*) [69])
                           "ignoring vertex color layer, maximum number of color sets exceeded: ");
                pbVar7 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                         Formatter::
                         basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                         operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                                     *)&local_458,(int *)((long)&source_local + 4));
                pbVar7 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                         Formatter::
                         basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                         operator<<(pbVar7,(char (*) [12])" (limit is ");
                local_45c = 8;
                pbVar7 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                         Formatter::
                         basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                         operator<<(pbVar7,&local_45c);
                pbVar8 = Formatter::
                         basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                         operator<<(pbVar7,(char (*) [2])0x2c30df);
                LogFunctions<Assimp::FBXImporter>::LogError(pbVar8);
                Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
                ~basic_formatter(&local_458);
                Name._0_4_ = 1;
                goto LAB_0021ca84;
              }
              ReadVertexDataColors
                        (this,this->m_colors + source_local._4_4_,(Scope *)MappingInformationType,
                         local_30,local_90);
            }
          }
        }
      }
    }
  }
  Name._0_4_ = 0;
LAB_0021ca84:
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void MeshGeometry::ReadVertexData(const std::string& type, int index, const Scope& source)
{
    const std::string& MappingInformationType = ParseTokenAsString(GetRequiredToken(
        GetRequiredElement(source,"MappingInformationType"),0)
    );

    const std::string& ReferenceInformationType = ParseTokenAsString(GetRequiredToken(
        GetRequiredElement(source,"ReferenceInformationType"),0)
    );

    if (type == "LayerElementUV") {
        if(index >= AI_MAX_NUMBER_OF_TEXTURECOORDS) {
            FBXImporter::LogError(Formatter::format("ignoring UV layer, maximum number of UV channels exceeded: ")
                << index << " (limit is " << AI_MAX_NUMBER_OF_TEXTURECOORDS << ")" );
            return;
        }

        const Element* Name = source["Name"];
        m_uvNames[index] = "";
        if(Name) {
            m_uvNames[index] = ParseTokenAsString(GetRequiredToken(*Name,0));
        }

        ReadVertexDataUV(m_uvs[index],source,
            MappingInformationType,
            ReferenceInformationType
        );
    }
    else if (type == "LayerElementMaterial") {
        if (m_materials.size() > 0) {
            FBXImporter::LogError("ignoring additional material layer");
            return;
        }

        std::vector<int> temp_materials;

        ReadVertexDataMaterials(temp_materials,source,
            MappingInformationType,
            ReferenceInformationType
        );

        // sometimes, there will be only negative entries. Drop the material
        // layer in such a case (I guess it means a default material should
        // be used). This is what the converter would do anyway, and it
        // avoids losing the material if there are more material layers
        // coming of which at least one contains actual data (did observe
        // that with one test file).
        const size_t count_neg = std::count_if(temp_materials.begin(),temp_materials.end(),[](int n) { return n < 0; });
        if(count_neg == temp_materials.size()) {
            FBXImporter::LogWarn("ignoring dummy material layer (all entries -1)");
            return;
        }

        std::swap(temp_materials, m_materials);
    }
    else if (type == "LayerElementNormal") {
        if (m_normals.size() > 0) {
            FBXImporter::LogError("ignoring additional normal layer");
            return;
        }

        ReadVertexDataNormals(m_normals,source,
            MappingInformationType,
            ReferenceInformationType
        );
    }
    else if (type == "LayerElementTangent") {
        if (m_tangents.size() > 0) {
            FBXImporter::LogError("ignoring additional tangent layer");
            return;
        }

        ReadVertexDataTangents(m_tangents,source,
            MappingInformationType,
            ReferenceInformationType
        );
    }
    else if (type == "LayerElementBinormal") {
        if (m_binormals.size() > 0) {
            FBXImporter::LogError("ignoring additional binormal layer");
            return;
        }

        ReadVertexDataBinormals(m_binormals,source,
            MappingInformationType,
            ReferenceInformationType
        );
    }
    else if (type == "LayerElementColor") {
        if(index >= AI_MAX_NUMBER_OF_COLOR_SETS) {
            FBXImporter::LogError(Formatter::format("ignoring vertex color layer, maximum number of color sets exceeded: ")
                << index << " (limit is " << AI_MAX_NUMBER_OF_COLOR_SETS << ")" );
            return;
        }

        ReadVertexDataColors(m_colors[index],source,
            MappingInformationType,
            ReferenceInformationType
        );
    }
}